

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O1

void __thiscall amrex::Amr::regrid(Amr *this,int lbase,Real time,bool initial)

{
  ofstream *os;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  __uniq_ptr_data<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>,_true,_true> _Var1;
  pointer puVar2;
  tuple<amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_> tVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  long *plVar4;
  pointer piVar5;
  char cVar6;
  uint uVar7;
  pointer pBVar8;
  undefined1 auVar9 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  bool bVar11;
  int iVar12;
  long *plVar13;
  ostream *poVar14;
  long lVar15;
  long lVar16;
  undefined7 in_register_00000011;
  long lVar17;
  Amr *pAVar18;
  long lVar19;
  undefined8 *puVar20;
  undefined8 *puVar21;
  int iVar22;
  long lVar23;
  ulong uVar24;
  byte bVar25;
  int new_finest;
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> new_grid_places;
  Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> new_dmap;
  int local_23c;
  ulong local_238;
  Amr *local_230;
  uint local_224;
  undefined4 local_220;
  char local_219;
  ulong local_218;
  Real local_210;
  vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> local_208;
  ulong local_1f0;
  long local_1e8;
  long local_1e0;
  vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> local_1d8;
  long local_1c0;
  undefined1 local_1b8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1b0;
  pointer local_1a8;
  undefined8 auStack_1a0 [46];
  
  bVar25 = 0;
  local_220 = (undefined4)CONCAT71(in_register_00000011,initial);
  iVar22 = *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
  iVar12 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level + -1;
  if (iVar22 <= iVar12) {
    iVar12 = iVar22;
  }
  if (lbase <= iVar12) {
    local_210 = time;
    if (0 < (this->super_AmrCore).super_AmrMesh.super_AmrInfo.verbose) {
      p_Stack_1b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)OutStream();
      local_1b8._4_4_ = *(MPI_Comm *)(DAT_00756620 + -0x48);
      local_1b8._0_4_ = *(int *)(DAT_00756620 + -0x30);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      *(undefined8 *)((long)auStack_1a0 + *(long *)local_1a8[-2].vect) =
           *(undefined8 *)
            ((long)&p_Stack_1b0->_M_use_count + (long)p_Stack_1b0->_vptr__Sp_counted_base[-3]);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,"Now regridding at level lbase = ",0x20);
      std::ostream::operator<<((ostringstream *)&local_1a8,lbase);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
      Print::~Print((Print *)local_1b8);
    }
    std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::vector
              (&local_208,(long)(this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level + 1,
               (allocator_type *)local_1b8);
    std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::vector
              (&local_1d8,(long)(this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level + 1,
               (allocator_type *)local_1b8);
    grid_places(this,lbase,local_210,&local_23c,
                (Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)&local_208);
    bVar11 = false;
    if ((lbase == 0 && (char)local_220 == '\0') &&
       (bVar11 = true, this->loadbalance_with_workestimates == 0)) {
      bVar11 = BoxArray::operator!=
                         (local_208.
                          super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (BoxArray *)
                          ((long)(((this->amr_level).
                                   super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                   .
                                   super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                 super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                          + 0xd8));
    }
    local_224 = lbase + 1;
    if (bVar11 != false) {
      local_224 = 0;
    }
    iVar22 = *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
    uVar24 = (ulong)(iVar22 == local_23c);
    iVar12 = iVar22;
    if (local_23c < iVar22) {
      iVar12 = local_23c;
    }
    local_230 = this;
    local_1f0 = (ulong)(uint)lbase;
    if ((int)local_224 <= iVar12) {
      local_238 = CONCAT44(local_238._4_4_,CONCAT31((int3)((uint)iVar22 >> 8),iVar22 == local_23c));
      lVar23 = (long)(int)local_224;
      lVar19 = lVar23 * 0x68;
      lVar17 = lVar23 * 8;
      uVar24 = lVar23 << 4 | 8;
      iVar22 = (iVar12 - local_224) + 1;
      do {
        bVar11 = BoxArray::operator==
                           ((BoxArray *)
                            ((long)&((local_208.
                                      super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->m_bat).m_bat_type
                            + lVar19),
                            (BoxArray *)
                            (*(long *)((long)&(((this->amr_level).
                                                super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                                .
                                                super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                              super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                      + lVar17) + 0xd8));
        pBVar8 = local_208.super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if (bVar11) {
          local_218 = CONCAT44(local_218._4_4_,iVar22);
          lVar23 = *(long *)((long)&(((this->amr_level).
                                      super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                      .
                                      super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                    super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                            + lVar17);
          puVar20 = (undefined8 *)(lVar23 + 0xd8);
          puVar21 = (undefined8 *)
                    ((long)&((local_208.
                              super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                              _M_impl.super__Vector_impl_data._M_start)->m_bat).m_bat_type + lVar19)
          ;
          for (lVar15 = 9; lVar15 != 0; lVar15 = lVar15 + -1) {
            *puVar21 = *puVar20;
            puVar20 = puVar20 + (ulong)bVar25 * -2 + 1;
            puVar21 = puVar21 + (ulong)bVar25 * -2 + 1;
          }
          this_00 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)&((local_208.
                              super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                              _M_impl.super__Vector_impl_data._M_start)->m_ref).
                            super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                            ._M_pi + lVar19);
          this_00[-1]._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar23 + 0x120);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (this_00,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(lVar23 + 0x128));
          this = local_230;
          this_00[1]._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar23 + 0x130);
          iVar22 = (int)local_218;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)&(pBVar8->m_simplified_list).
                             super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi + lVar19),
                     (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(lVar23 + 0x138));
          lVar23 = *(long *)((long)&(((this->amr_level).
                                      super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                      .
                                      super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                    super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                            + lVar17);
          *(undefined8 *)
           ((long)&((local_1d8.
                     super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                     ._M_impl.super__Vector_impl_data._M_start)->m_ref).
                   super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr + lVar17 * 2) = *(undefined8 *)(lVar23 + 0x140);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)&((local_1d8.
                               super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_ref).
                             super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr + uVar24),
                     (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(lVar23 + 0x148));
        }
        else {
          local_238 = local_238 & 0xffffffff00000000;
        }
        lVar19 = lVar19 + 0x68;
        lVar17 = lVar17 + 8;
        uVar24 = uVar24 + 0x10;
        iVar22 = iVar22 + -1;
      } while (iVar22 != 0);
      lbase = (int)local_1f0;
      uVar24 = local_238 & 0xffffffff;
    }
    uVar7 = local_224;
    if (((anonymous_namespace)::use_efficient_regrid == 1) && ((uVar24 & 1) != 0)) {
      if (0 < (this->super_AmrCore).super_AmrMesh.super_AmrInfo.verbose) {
        p_Stack_1b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)OutStream();
        local_1b8._4_4_ = *(MPI_Comm *)(DAT_00756620 + -0x48);
        local_1b8._0_4_ = *(int *)(DAT_00756620 + -0x30);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        *(undefined8 *)((long)auStack_1a0 + *(long *)local_1a8[-2].vect) =
             *(undefined8 *)
              ((long)&p_Stack_1b0->_M_use_count + (long)p_Stack_1b0->_vptr__Sp_counted_base[-3]);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"Regridding at level lbase = ",0x1c);
        std::ostream::operator<<((ostringstream *)&local_1a8,lbase);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8," but grids unchanged\n",0x15);
        Print::~Print((Print *)local_1b8);
      }
    }
    else {
      if ((int)local_224 <= *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c) {
        lVar17 = (long)(int)local_224 + -1;
        do {
          _Var1.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
          super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
          super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
               (this->amr_level).
               super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
               .
               super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar17 + 1]._M_t.
               super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
          if (*(int *)((long)_Var1.
                             super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                             .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x20c)
              == 0) {
            (**(code **)(*(long *)_Var1.
                                  super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                  .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl +
                        0xd0))();
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 < *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c);
      }
      lVar17 = (long)local_23c;
      iVar22 = local_23c;
      if (local_23c < *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c) {
        do {
          iVar22 = iVar22 + 1;
          puVar2 = (this->amr_level).
                   super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                   .
                   super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          tVar3.super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
          super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
               *(_Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_> *)
                &puVar2[lVar17 + 1]._M_t.
                 super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
          puVar2[lVar17 + 1]._M_t.
          super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> =
               (__uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>)0x0;
          if (tVar3.super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
              .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl !=
              (_Head_base<0UL,_amrex::AmrLevel_*,_false>)0x0) {
            (**(code **)(*(long *)tVar3.
                                  super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                  .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 8)
            )();
          }
          lVar17 = lVar17 + 1;
          AmrMesh::ClearBoxArray((AmrMesh *)this,iVar22);
          AmrMesh::ClearDistributionMap((AmrMesh *)this,iVar22);
        } while (lVar17 < *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c);
      }
      *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c = local_23c;
      if ((int)uVar7 <= local_23c) {
        local_1e8 = (long)(int)local_224;
        local_238 = local_1e8 * 8;
        local_218 = (ulong)local_224;
        lVar23 = local_1e8 << 4;
        lVar15 = local_1e8 * 0x68;
        local_1c0 = local_1e8 * 4;
        lVar17 = local_1e8 * 200;
        lVar19 = 0;
        do {
          iVar22 = (int)lVar19;
          if (this->loadbalance_with_workestimates == 0 || (char)local_220 != '\0') {
            plVar13 = *(long **)((long)&((local_1d8.
                                          super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->m_ref).
                                        super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr + lVar23);
            if (*plVar13 == plVar13[1]) {
              DistributionMapping::define
                        ((DistributionMapping *)
                         ((long)&((local_1d8.
                                   super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->m_ref).
                                 super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr + lVar23),
                         (BoxArray *)
                         ((long)&((local_208.
                                   super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->m_bat).m_bat_type +
                         lVar15),*(int *)(ParallelContext::frames + 0x10));
            }
          }
          else {
            makeLoadBalanceDistributionMap
                      ((Amr *)local_1b8,(int)this,local_210,
                       (BoxArray *)(ulong)(uint)((int)local_218 + iVar22));
            p_Var10 = p_Stack_1b0;
            auVar9 = local_1b8;
            local_1b8 = (undefined1  [8])0x0;
            p_Stack_1b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            this_01 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                       ((long)&((local_1d8.
                                 super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_ref).
                               super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi + lVar23);
            puVar20 = (undefined8 *)
                      ((long)&((local_1d8.
                                super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_ref).
                              super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr + lVar23);
            *puVar20 = auVar9;
            puVar20[1] = p_Var10;
            if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
            }
            if (p_Stack_1b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1b0);
            }
          }
          plVar13 = (long *)(**(code **)(*(long *)this->levelbld + 0x30))
                                      (SUB84(this->cumtime,0),this->levelbld,this,
                                       (int)local_218 + iVar22,
                                       (long)(((this->super_AmrCore).super_AmrMesh.geom.
                                               super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                               .
                                               super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                             super_CoordSys).offset + lVar17 + 0xfffffffffffffff8U,
                                       (long)&((local_208.
                                                super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->m_bat).
                                              m_bat_type + lVar15,
                                       (long)&((local_1d8.
                                                super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->m_ref).
                                              super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_ptr + lVar23);
          local_1e0 = lVar17;
          if ((char)local_220 == '\0') {
            if (*(long *)((long)&(local_230->amr_level).
                                 super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                 .
                                 super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[lVar19]._M_t.
                                 super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                         + local_238) == 0) {
              (**(code **)(*plVar13 + 0xe0))(plVar13);
              puVar2 = (local_230->amr_level).
                       super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                       .
                       super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              plVar4 = *(long **)((long)&puVar2[lVar19]._M_t.
                                         super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                 + local_238);
              *(long **)((long)&puVar2[lVar19]._M_t.
                                super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                        + local_238) = plVar13;
              if (plVar4 != (long *)0x0) {
                (**(code **)(*plVar4 + 8))();
              }
              pAVar18 = local_230;
              if (0 < local_1e8 + lVar19) {
                piVar5 = (local_230->level_steps).super_vector<int,_std::allocator<int>_>.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
                *(int *)((long)piVar5 + lVar19 * 4 + local_1c0) =
                     *(int *)((long)(local_230->n_cycle).super_vector<int,_std::allocator<int>_>.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start + lVar19 * 4 + local_1c0 + -4)
                     * *(int *)((long)piVar5 + lVar19 * 4 + local_1c0 + -4);
              }
            }
            else {
              (**(code **)(*plVar13 + 0xd8))(plVar13);
              pAVar18 = local_230;
              puVar2 = (local_230->amr_level).
                       super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                       .
                       super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              plVar4 = *(long **)((long)&puVar2[lVar19]._M_t.
                                         super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                 + local_238);
              *(long **)((long)&puVar2[lVar19]._M_t.
                                super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                        + local_238) = plVar13;
              if (plVar4 != (long *)0x0) {
                (**(code **)(*plVar4 + 8))();
              }
            }
            uVar24 = local_238;
            iVar22 = (int)local_218 + iVar22;
            AmrMesh::SetBoxArray
                      ((AmrMesh *)pAVar18,iVar22,
                       (BoxArray *)
                       (*(long *)((long)&(pAVar18->amr_level).
                                         super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                         .
                                         super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[lVar19]._M_t.
                                         super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                 + local_238) + 0xd8));
            AmrMesh::SetDistributionMap
                      ((AmrMesh *)pAVar18,iVar22,
                       (DistributionMapping *)
                       (*(long *)((long)&(pAVar18->amr_level).
                                         super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                         .
                                         super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[lVar19]._M_t.
                                         super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                 + uVar24) + 0x140));
          }
          else {
            puVar2 = (local_230->amr_level).
                     super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                     .
                     super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            plVar4 = *(long **)((long)&puVar2[lVar19]._M_t.
                                       super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                               + local_238);
            *(long **)((long)&puVar2[lVar19]._M_t.
                              super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                      + local_238) = plVar13;
            if (plVar4 != (long *)0x0) {
              (**(code **)(*plVar4 + 8))();
            }
            pAVar18 = local_230;
            uVar24 = local_238;
            iVar22 = (int)local_218 + iVar22;
            AmrMesh::SetBoxArray
                      ((AmrMesh *)local_230,iVar22,
                       (BoxArray *)
                       (*(long *)((long)&(local_230->amr_level).
                                         super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                         .
                                         super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[lVar19]._M_t.
                                         super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                 + local_238) + 0xd8));
            AmrMesh::SetDistributionMap
                      ((AmrMesh *)pAVar18,iVar22,
                       (DistributionMapping *)
                       (*(long *)((long)&(pAVar18->amr_level).
                                         super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                         .
                                         super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[lVar19]._M_t.
                                         super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                 + uVar24) + 0x140));
            (**(code **)(**(long **)((long)&(pAVar18->amr_level).
                                            super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                            .
                                            super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[lVar19]._M_t.
                                            super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                    + uVar24) + 0xb8))();
          }
          lVar16 = local_1e8 + lVar19;
          lVar19 = lVar19 + 1;
          lVar23 = lVar23 + 0x10;
          lVar15 = lVar15 + 0x68;
          lVar17 = local_1e0 + 200;
          this = local_230;
        } while (lVar16 < local_23c);
      }
      uVar24 = local_1f0;
      uVar7 = local_224;
      iVar22 = (int)local_1f0;
      if (-1 < local_23c) {
        lVar17 = -1;
        do {
          _Var1.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
          super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
          super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
               (this->amr_level).
               super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
               .
               super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar17 + 1]._M_t.
               super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
          (**(code **)(*(long *)_Var1.
                                super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x98
                      ))(_Var1.
                         super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                         .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,
                         uVar24 & 0xffffffff);
          lVar17 = lVar17 + 1;
        } while (lVar17 < local_23c);
      }
      if ((this->record_run_info != 0) && (*(int *)(ParallelContext::frames + 0xc) == 0)) {
        os = &this->runlog;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)os,"REGRID: at level lbase = ",0x19);
        poVar14 = (ostream *)std::ostream::operator<<(os,iVar22);
        local_1b8[0] = 10;
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,local_1b8,1);
        printGridInfo(this,(ostream *)os,uVar7,
                      *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c);
      }
      if ((this->record_grid_info != 0) && (*(int *)(ParallelContext::frames + 0xc) == 0)) {
        if (iVar22 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->gridlog,"STEP = ",7);
          poVar14 = (ostream *)
                    std::ostream::operator<<
                              (&this->gridlog,
                               *(this->level_steps).super_vector<int,_std::allocator<int>_>.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
          local_1b8[0] = 0x20;
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,local_1b8,1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->gridlog,"TIME = ",7);
        poVar14 = std::ostream::_M_insert<double>(local_210);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14," : REGRID  with lbase = ",0x18);
        poVar14 = (ostream *)std::ostream::operator<<(poVar14,iVar22);
        local_1b8[0] = 10;
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,local_1b8,1);
        printGridInfo(this,(ostream *)&this->gridlog,uVar7,
                      *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c);
      }
      if ((0 < (this->super_AmrCore).super_AmrMesh.super_AmrInfo.verbose) &&
         (*(int *)(ParallelContext::frames + 0xc) == 0)) {
        if (iVar22 == 0) {
          p_Stack_1b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)OutStream();
          local_1b8._4_4_ = *(MPI_Comm *)(DAT_00756620 + -0x48);
          local_1b8._0_4_ = *(int *)(DAT_00756620 + -0x30);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
          *(undefined8 *)((long)auStack_1a0 + *(long *)local_1a8[-2].vect) =
               *(undefined8 *)
                ((long)&p_Stack_1b0->_M_use_count + (long)p_Stack_1b0->_vptr__Sp_counted_base[-3]);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"STEP = ",7);
          std::ostream::operator<<
                    ((ostringstream *)&local_1a8,
                     *(this->level_steps).super_vector<int,_std::allocator<int>_>.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start);
          local_219 = ' ';
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,&local_219,1);
          Print::~Print((Print *)local_1b8);
        }
        p_Stack_1b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)OutStream();
        local_1b8._4_4_ = *(MPI_Comm *)(DAT_00756620 + -0x48);
        local_1b8._0_4_ = *(int *)(DAT_00756620 + -0x30);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        *(undefined8 *)((long)auStack_1a0 + *(long *)local_1a8[-2].vect) =
             *(undefined8 *)
              ((long)&p_Stack_1b0->_M_use_count + (long)p_Stack_1b0->_vptr__Sp_counted_base[-3]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"TIME = ",7);
        std::ostream::_M_insert<double>(local_210);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8," : REGRID  with lbase = ",0x18);
        std::ostream::operator<<((ostringstream *)&local_1a8,iVar22);
        cVar6 = (char)(ostringstream *)&local_1a8;
        std::ios::widen((char)*(undefined8 *)local_1a8[-2].vect + cVar6);
        std::ostream::put(cVar6);
        std::ostream::flush();
        Print::~Print((Print *)local_1b8);
        if ((this->super_AmrCore).super_AmrMesh.super_AmrInfo.verbose < 2) {
          poVar14 = OutStream();
          AmrCore::printGridSummary
                    (&this->super_AmrCore,poVar14,uVar7,
                     *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c);
        }
        else {
          poVar14 = OutStream();
          printGridInfo(this,poVar14,uVar7,
                        *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c);
        }
      }
    }
    std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::~vector
              (&local_1d8);
    std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::~vector(&local_208);
  }
  return;
}

Assistant:

void
Amr::regrid (int  lbase,
             Real time,
             bool initial)
{
    BL_PROFILE("Amr::regrid()");

    if (lbase > std::min(finest_level,max_level-1)) return;

    if (verbose > 0)
        amrex::Print() << "Now regridding at level lbase = " << lbase << "\n";

    //
    // Compute positions of new grids.
    //
    int             new_finest;
    Vector<BoxArray> new_grid_places(max_level+1);
    Vector<DistributionMapping> new_dmap(max_level+1);

    grid_places(lbase,time,new_finest, new_grid_places);

    bool regrid_level_zero = (!initial) && (lbase == 0)
        && ( loadbalance_with_workestimates || (new_grid_places[0] != amr_level[0]->boxArray()));

    const int start = regrid_level_zero ? 0 : lbase+1;

    bool grids_unchanged = finest_level == new_finest;
    for (int lev = start, End = std::min(finest_level,new_finest); lev <= End; lev++) {
        if (new_grid_places[lev] == amr_level[lev]->boxArray()) {
            new_grid_places[lev] = amr_level[lev]->boxArray();  // to avoid duplicates
            new_dmap[lev] = amr_level[lev]->DistributionMap();
        } else {
            grids_unchanged = false;
        }
    }

    //
    // If use_efficient_regrid flag is set and grids are unchanged, then don't do anything more here.
    //
    if (use_efficient_regrid == 1 && grids_unchanged )
    {
        if (verbose > 0) {
            amrex::Print() << "Regridding at level lbase = " << lbase
                           << " but grids unchanged\n";
        }
        return;
    }

    //
    // Reclaim old-time grid space for all remain levels > lbase.
    // But skip this if we're in the middle of a post-timestep regrid.
    //
    for(int lev = start; lev <= finest_level; ++lev) {
        if (!amr_level[lev]->postStepRegrid()) {
            amr_level[lev]->removeOldData();
        }
    }
    //
    // Reclaim all remaining storage for levels > new_finest.
    //
    for(int lev = new_finest + 1; lev <= finest_level; ++lev) {
        amr_level[lev].reset();
        this->ClearBoxArray(lev);
        this->ClearDistributionMap(lev);
    }

    finest_level = new_finest;

    //
    // Define the new grids from level start up to new_finest.
    //
    for(int lev = start; lev <= new_finest; ++lev) {
        //
        // Construct skeleton of new level.
        //

        if (loadbalance_with_workestimates && !initial) {
            new_dmap[lev] = makeLoadBalanceDistributionMap(lev, time, new_grid_places[lev]);
        }
        else if (new_dmap[lev].empty()) {
            new_dmap[lev].define(new_grid_places[lev]);
        }

        AmrLevel* a = (*levelbld)(*this,lev,Geom(lev),new_grid_places[lev],
                                  new_dmap[lev],cumtime);

        if (initial)
        {
            //
            // We're being called on startup from bldFineLevels().
            // NOTE: The initData function may use a filPatch, and so needs to
            //       be officially inserted into the hierarchy prior to the call.
            //
            amr_level[lev].reset(a);
            this->SetBoxArray(lev, amr_level[lev]->boxArray());
            this->SetDistributionMap(lev, amr_level[lev]->DistributionMap());
            amr_level[lev]->initData();
        }
        else if (amr_level[lev])
        {
            //
            // Init with data from old structure then remove old structure.
            // NOTE: The init function may use a filPatch from the old level,
            //       which therefore needs remain in the hierarchy during the call.
            //
            a->init(*amr_level[lev]);
            amr_level[lev].reset(a);
            this->SetBoxArray(lev, amr_level[lev]->boxArray());
            this->SetDistributionMap(lev, amr_level[lev]->DistributionMap());
        }
        else
        {
            a->init();
            amr_level[lev].reset(a);
            if (lev > 0)
                level_steps[lev] = level_steps[lev-1] * n_cycle[lev-1];
            this->SetBoxArray(lev, amr_level[lev]->boxArray());
            this->SetDistributionMap(lev, amr_level[lev]->DistributionMap());
        }

    }


    //
    // Check at *all* levels whether we need to do anything special now that the grids
    //       at levels lbase+1 and higher may have changed.
    //
    for(int lev(0); lev <= new_finest; ++lev) {
        amr_level[lev]->post_regrid(lbase,new_finest);
    }

    //
    // Report creation of new grids.
    //

    if (record_run_info && ParallelDescriptor::IOProcessor())
    {
        runlog << "REGRID: at level lbase = " << lbase << '\n';
        printGridInfo(runlog,start,finest_level);
    }

    if (record_grid_info && ParallelDescriptor::IOProcessor())
    {
        if (lbase == 0)
            gridlog << "STEP = " << level_steps[0] << ' ';

        gridlog << "TIME = "
                << time
                << " : REGRID  with lbase = "
                << lbase
                << '\n';

        printGridInfo(gridlog,start,finest_level);
    }

    if (verbose > 0 && ParallelDescriptor::IOProcessor())
    {
        if (lbase == 0) {
            amrex::Print() << "STEP = " << level_steps[0] << ' ';
        }

        amrex::Print() << "TIME = "
                       << time
                       << " : REGRID  with lbase = "
                       << lbase
                       << std::endl;

        if (verbose > 1)
        {
            printGridInfo(amrex::OutStream(),start,finest_level);
        }
        else
        {
            printGridSummary(amrex::OutStream(),start,finest_level);
        }
    }
}